

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O1

void __thiscall OpenMD::HydroIO::closeWriter(HydroIO *this,ostream *os)

{
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(&this->w_,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&this->w_,0);
  if (this->osw_ != (OStreamWrapper *)0x0) {
    operator_delete(this->osw_,8);
  }
  this->writerOpen_ = false;
  return;
}

Assistant:

void HydroIO::closeWriter(std::ostream& os) {
#if defined(NLOHMANN_JSON)
    os << j_.dump(2) << std::endl;
#elif defined(RAPID_JSON)
    w_.EndArray();
    w_.EndObject();
    delete osw_;
#endif
    writerOpen_ = false;
  }